

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<derived_*const_&,_base_*const_&>::streamReconstructedExpression
          (BinaryExpr<derived_*const_&,_base_*const_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  size_t in_RCX;
  string *in_R9;
  StringRef op;
  string local_68;
  base *local_48;
  string local_40;
  
  local_68._M_dataplus._M_p = (pointer)*this->m_lhs;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
    local_40._M_string_length = 7;
    local_40.field_2._M_allocated_capacity._4_4_ = 0x727470;
  }
  else {
    Detail::rawMemoryToString_abi_cxx11_(&local_40,(Detail *)&local_68,(void *)0x8,in_RCX);
  }
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  local_48 = *this->m_rhs;
  if (local_48 == (base *)0x0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
    local_68._M_string_length = 7;
    local_68.field_2._M_allocated_capacity._4_4_ = 0x727470;
  }
  else {
    Detail::rawMemoryToString_abi_cxx11_(&local_68,(Detail *)&local_48,(void *)0x8,in_RCX);
  }
  op.m_size = (size_type)&local_68;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                             local_68.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT44(local_40.field_2._M_allocated_capacity._4_4_,
                             local_40.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }